

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_lib_destroy(void)

{
  block_s *blk;
  anon_struct_32_4_90625080 *paVar1;
  int iVar2;
  uint uVar3;
  arena_s *paVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  iVar2 = fio_is_master();
  fio_data->active = '\0';
  fio_on_fork();
  fio_defer_perform();
  fio_timer_clear_all();
  fio_defer_perform();
  fio_state_callback_force(FIO_CALL_AT_EXIT);
  fio_state_callback_clear_all();
  fio_defer_perform();
  fio_poll_close();
  fio_free(fio_data);
  if (arenas != (arena_s *)0x0) {
    lVar6 = 0;
    paVar4 = arenas;
    uVar5 = memory.cores;
    for (uVar7 = 0; uVar7 < uVar5; uVar7 = uVar7 + 1) {
      blk = *(block_s **)((long)&paVar4->block + lVar6);
      if (blk != (block_s *)0x0) {
        block_free(blk);
        paVar4 = arenas;
        uVar5 = memory.cores;
      }
      *(undefined8 *)((long)&paVar4->block + lVar6) = 0;
      lVar6 = lVar6 + 0x10;
    }
    if ((memory.forked == '\0') && ((anon_struct_32_4_90625080 *)memory.available.next != &memory))
    {
      if (2 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "WARNING: facil.io detected memory traces remaining after cleanup - memory leak?"
                      );
      }
      paVar1 = (anon_struct_32_4_90625080 *)&memory.available;
      lVar6 = 0;
      while (paVar1 = (anon_struct_32_4_90625080 *)(paVar1->available).next, paVar1 != &memory) {
        lVar6 = lVar6 + 1;
      }
      if (4 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7328): Memory blocks in pool: %zu (%zu blocks per allocation)."
                       ,lVar6,0x100);
      }
    }
    big_free(arenas);
    arenas = (arena_s *)0x0;
  }
  if (4 < FIO_LOG_LEVEL) {
    uVar3 = getpid();
    FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:3548): (%d) facil.io resources released, exit complete."
                   ,(ulong)uVar3);
  }
  if (iVar2 != 0) {
    fputc(10,_stderr);
    return;
  }
  return;
}

Assistant:

static void __attribute__((destructor)) fio_lib_destroy(void) {
  uint8_t add_eol = fio_is_master();
  fio_data->active = 0;
  fio_on_fork();
  fio_defer_perform();
  fio_timer_clear_all();
  fio_defer_perform();
  fio_state_callback_force(FIO_CALL_AT_EXIT);
  fio_state_callback_clear_all();
  fio_defer_perform();
  fio_poll_close();
  fio_free(fio_data);
  /* memory library destruction must be last */
  fio_mem_destroy();
  FIO_LOG_DEBUG("(%d) facil.io resources released, exit complete.",
                (int)getpid());
  if (add_eol)
    fprintf(stderr, "\n"); /* add EOL to logs (logging adds EOL before text */
}